

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFloat
          (FastFieldValuePrinter *this,float val,BaseTextGenerator *generator)

{
  string local_28;
  
  if (NAN(val)) {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_28,"nan","");
  }
  else {
    SimpleFtoa_abi_cxx11_(&local_28,(protobuf *)generator,val);
  }
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_28._M_dataplus._M_p,local_28._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFloat(
    float val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? SimpleFtoa(val) : "nan");
}